

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
::AssembleElement(TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
                  *this,TPZCompEl *el,TPZElementMatrix *ekb,TPZElementMatrix *efb,
                 TPZMatrix<std::complex<double>_> *stiffness,TPZFMatrix<std::complex<double>_> *rhs)

{
  TPZManVector<long,_10> *orig;
  TPZManVector<long,_10> *dest;
  int iVar1;
  TPZElementMatrix *this_00;
  long *plVar2;
  long lVar3;
  
  this_00 = (TPZElementMatrix *)
            __dynamic_cast(ekb,&TPZElementMatrix::typeinfo,
                           &TPZElementMatrixT<std::complex<double>>::typeinfo,0);
  if (this_00 != (TPZElementMatrix *)0x0) {
    plVar2 = (long *)__dynamic_cast(efb,&TPZElementMatrix::typeinfo,
                                    &TPZElementMatrixT<std::complex<double>>::typeinfo,0);
    if (plVar2 != (long *)0x0) {
      iVar1 = (**(code **)(*(long *)el + 0x1f0))(el);
      if (iVar1 == 0) {
        lVar3 = 0x1f0;
      }
      else {
        (*this_00->_vptr_TPZElementMatrix[6])(this_00);
        (**(code **)(*plVar2 + 0x30))(plVar2);
        lVar3 = 0x41e0;
      }
      TPZElementMatrix::ComputeDestinationIndices(this_00);
      orig = &this_00->fSourceIndex;
      dest = &this_00->fDestinationIndex;
      TPZEquationFilter::Filter
                ((TPZEquationFilter *)&this->field_0x48,&orig->super_TPZVec<long>,
                 &dest->super_TPZVec<long>);
      (*(stiffness->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x34])
                (stiffness,
                 (long)(this_00->fConnect).super_TPZManVector<long,_10>.fExtAlloc + lVar3 + -0x38,
                 orig,dest);
      TPZFMatrix<std::complex<double>_>::AddFel
                (rhs,(TPZFMatrix<std::complex<double>_> *)((long)plVar2 + lVar3),
                 &orig->super_TPZVec<long>,&dest->super_TPZVec<long>);
      return;
    }
  }
  __cxa_bad_cast();
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::AssembleElement(TPZCompEl * el, TPZElementMatrix & ekb, TPZElementMatrix & efb, TPZMatrix<TVar> & stiffness, TPZFMatrix<TVar> & rhs){
	//TODOCOMPLEX
    auto &ek =
		dynamic_cast<TPZElementMatrixT<TVar>&>(ekb);
	auto &ef =
		dynamic_cast<TPZElementMatrixT<TVar>&>(efb);
	
	if(!el->HasDependency()) {
		//ek.fMat->Print("stiff has no constraint",test);
		//ef.fMat->Print("rhs has no constraint",test);
		//test.flush();
		ek.ComputeDestinationIndices();
		this->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
            std::stringstream sout;
            sout << "Element index " << el->Index() << " Unconstrained destination index " << ek.fDestinationIndex;
            LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		//ek.Print(*fMesh,cout);
		stiffness.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
		rhs.AddFel(ef.fMat,ek.fSourceIndex, ek.fDestinationIndex);                 //  ??????????? Erro
	}
	else
	{
        ek.ApplyConstraints();
        ef.ApplyConstraints();
        ek.ComputeDestinationIndices();
        this->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
        {
			std::stringstream sout;
			sout << "Element index " << el->Index() << " Constrained destination index " << ek.fDestinationIndex;
			LOGPZ_DEBUG(logger,sout.str())
        }
#endif
        stiffness.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
        rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
	}
}